

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void receive_particle_slice(int left,int width,int rank,int x_diff)

{
  allocator_type local_6d;
  int particles_to_receive;
  int local_68;
  int local_64;
  vector<particle,_std::allocator<particle>_> particles;
  vector<int,_std::allocator<int>_> particle_numbers;
  
  local_68 = left;
  local_64 = x_diff;
  MPI_Recv(&particles_to_receive,1,&ompi_mpi_int,rank,0,&ompi_mpi_comm_world,0);
  std::vector<int,_std::allocator<int>_>::vector
            (&particle_numbers,(long)nz_global * (long)width * (long)ny_global,
             (allocator_type *)&particles);
  MPI_Recv(particle_numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,
           (ulong)((long)particle_numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)particle_numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2,&ompi_mpi_int,rank,1,
           &ompi_mpi_comm_world,0);
  std::vector<particle,_std::allocator<particle>_>::vector
            (&particles,(long)particles_to_receive,&local_6d);
  MPI_Recv(particles.super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_start,particles_to_receive,MPI_PARTICLE,rank,2,
           &ompi_mpi_comm_world,0);
  unpack_particle_slice(local_68,width,&particle_numbers,&particles,local_64);
  std::_Vector_base<particle,_std::allocator<particle>_>::~_Vector_base
            (&particles.super__Vector_base<particle,_std::allocator<particle>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&particle_numbers.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void receive_particle_slice(int left, int width, int rank, int x_diff) {
    int particles_to_receive;
    MPI_Recv(&particles_to_receive, 1, MPI_INT, rank, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

    vector<int> particle_numbers(width * ny_global * nz_global);
    MPI_Recv(&(particle_numbers[0]), particle_numbers.size(), MPI_INT, rank, 1, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

    vector<particle> particles(particles_to_receive);

    MPI_Recv(&(particles[0]), particles_to_receive, MPI_PARTICLE, rank, 2, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
    unpack_particle_slice(left, width, particle_numbers, particles, x_diff);
}